

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_log_unregister_callback(ma_log *pLog,ma_log_callback callback)

{
  uint uVar1;
  ulong uVar2;
  ma_log_callback *pmVar3;
  ma_uint32 mVar4;
  
  if (pLog != (ma_log *)0x0) {
    if (pLog->callbackCount != 0) {
      uVar1 = 0;
      do {
        uVar2 = (ulong)uVar1;
        if (pLog->callbacks[uVar2].onLog == callback.onLog) {
          mVar4 = pLog->callbackCount - 1;
          if (uVar1 < mVar4) {
            pmVar3 = pLog->callbacks + uVar2 + 1;
            do {
              uVar2 = uVar2 + 1;
              pmVar3[-1].onLog = pmVar3->onLog;
              *(void **)((long)(pmVar3 + -1) + 8) = pmVar3->pUserData;
              mVar4 = pLog->callbackCount - 1;
              pmVar3 = pmVar3 + 1;
            } while (uVar2 < mVar4);
          }
          pLog->callbackCount = mVar4;
        }
        else {
          uVar1 = uVar1 + 1;
        }
      } while (uVar1 < pLog->callbackCount);
    }
    return MA_SUCCESS;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_log_unregister_callback(ma_log* pLog, ma_log_callback callback)
{
    if (pLog == NULL) {
        return MA_INVALID_ARGS;
    }

    ma_log_lock(pLog);
    {
        ma_uint32 iLog;
        for (iLog = 0; iLog < pLog->callbackCount; ) {
            if (pLog->callbacks[iLog].onLog == callback.onLog) {
                /* Found. Move everything down a slot. */
                ma_uint32 jLog;
                for (jLog = iLog; jLog < pLog->callbackCount-1; jLog += 1) {
                    pLog->callbacks[jLog] = pLog->callbacks[jLog + 1];
                }

                pLog->callbackCount -= 1;
            } else {
                /* Not found. */
                iLog += 1;
            }
        }
    }
    ma_log_unlock(pLog);

    return MA_SUCCESS;
}